

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O3

bool __thiscall
ON_Triangle::GetTightBoundingBox
          (ON_Triangle *this,ON_BoundingBox *tight_bbox,bool bGrowBox,ON_Xform *xform)

{
  bool bVar1;
  bool bVar2;
  double *points;
  undefined7 in_register_00000011;
  long lVar3;
  uint bGrowBox_00;
  ON_3dPoint P;
  ON_3dPoint local_48;
  
  bGrowBox_00 = 0;
  if ((int)CONCAT71(in_register_00000011,bGrowBox) != 0) {
    bVar1 = ON_BoundingBox::IsValid(tight_bbox);
    bGrowBox_00 = (uint)bVar1;
  }
  if ((xform != (ON_Xform *)0x0) && (bVar1 = ON_Xform::IsIdentity(xform,0.0), !bVar1)) {
    bVar1 = true;
    lVar3 = 0;
    do {
      ON_Xform::operator*(&local_48,xform,(ON_3dPoint *)((long)&this->m_V[0].x + lVar3));
      bVar2 = ON_BoundingBox::Set(tight_bbox,&local_48,bGrowBox_00);
      bVar1 = (bool)(bVar1 & bVar2);
      lVar3 = lVar3 + 0x18;
      bGrowBox_00 = 1;
    } while (lVar3 != 0x48);
    return bVar1;
  }
  points = ON_3dPoint::operator_cast_to_double_(this->m_V);
  ON_BoundingBox::Set(tight_bbox,3,false,3,3,points,bGrowBox_00);
  return true;
}

Assistant:

bool ON_Triangle::GetTightBoundingBox(
	ON_BoundingBox& tight_bbox,
	bool bGrowBox,
	const ON_Xform* xform ) const
{
	if (bGrowBox && !tight_bbox.IsValid())
	{
		bGrowBox = false;
	}

	bool rc = true;
	if (xform && !xform->IsIdentity())
	{
		for (int i = 0; i < 3; i++)
		{
			ON_3dPoint P = (*xform)*m_V[i];
			rc = tight_bbox.Set(P, bGrowBox) && rc;
			bGrowBox = true;
		}
	}
	else
	{
		rc =GetBoundingBox(tight_bbox, bGrowBox);
	}

	return rc;
}